

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * jsonnet::internal::lex_number(char **c,string *filename,Location *begin)

{
  char cVar1;
  StaticError *this;
  Location *location;
  ostream *poVar2;
  undefined8 uVar3;
  string *in_RCX;
  long *in_RSI;
  string *in_RDI;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  State state;
  string *r;
  string *in_stack_fffffffffffffa08;
  Location *in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  StaticError *in_stack_fffffffffffffa20;
  stringstream local_548 [16];
  ostream local_538 [383];
  undefined1 local_3b9;
  stringstream local_398 [16];
  ostream local_388 [383];
  undefined1 local_209;
  stringstream local_1e8 [16];
  ostream local_1d8 [379];
  undefined1 local_5d;
  undefined1 local_25;
  undefined4 local_24;
  string *local_20;
  long *local_10;
  
  local_25 = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_24 = 0;
  do {
    switch(local_24) {
    case 0:
      if (*(char *)*local_10 == 0x30) {
        local_24 = 1;
      }
      else {
        if (8 < (int)*(char *)*local_10 - 0x31U) {
          local_5d = 1;
          uVar3 = __cxa_allocate_exception(0x60);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa20,
                     (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     (allocator<char> *)in_stack_fffffffffffffa10);
          StaticError::StaticError
                    (in_stack_fffffffffffffa20,
                     (string *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
          local_5d = 0;
          __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
        }
        local_24 = 2;
      }
      break;
    case 1:
      cVar1 = *(char *)*local_10;
      if (cVar1 == '.') {
        local_24 = 3;
      }
      else {
        if ((cVar1 != 'E') && (cVar1 != 'e')) {
          return in_RDI;
        }
        local_24 = 5;
      }
      break;
    case 2:
      switch(*(undefined1 *)*local_10) {
      case 0x2e:
        local_24 = 3;
        break;
      default:
        return in_RDI;
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        local_24 = 2;
        break;
      case 0x45:
      case 0x65:
        local_24 = 5;
      }
      break;
    case 3:
      if (9 < (int)*(char *)*local_10 - 0x30U) {
        std::__cxx11::stringstream::stringstream(local_1e8);
        poVar2 = std::operator<<(local_1d8,"couldn\'t lex number, junk after decimal point: ");
        std::operator<<(poVar2,*(char *)*local_10);
        local_209 = 1;
        this = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringstream::str();
        StaticError::StaticError
                  (this,(string *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        local_209 = 0;
        __cxa_throw(this,&StaticError::typeinfo,StaticError::~StaticError);
      }
      local_24 = 4;
      break;
    case 4:
      in_stack_fffffffffffffa1c = (int)*(char *)*local_10;
      if (in_stack_fffffffffffffa1c - 0x30U < 10) {
        local_24 = 4;
      }
      else {
        if ((in_stack_fffffffffffffa1c != 0x45) && (in_stack_fffffffffffffa1c != 0x65)) {
          return in_RDI;
        }
        local_24 = 5;
      }
      break;
    case 5:
      in_stack_fffffffffffffa18 = (int)*(char *)*local_10;
      if ((in_stack_fffffffffffffa18 == 0x2b) || (in_stack_fffffffffffffa18 == 0x2d)) {
        local_24 = 6;
      }
      else {
        if (9 < in_stack_fffffffffffffa18 - 0x30U) {
          std::__cxx11::stringstream::stringstream(local_398);
          location = (Location *)
                     std::operator<<(local_388,"couldn\'t lex number, junk after \'E\': ");
          std::operator<<((ostream *)location,*(char *)*local_10);
          local_3b9 = 1;
          uVar3 = __cxa_allocate_exception(0x60);
          std::__cxx11::stringstream::str();
          StaticError::StaticError
                    (in_stack_fffffffffffffa20,
                     (string *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     location,local_20);
          local_3b9 = 0;
          __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
        }
        local_24 = 7;
      }
      break;
    case 6:
      if (9 < (int)*(char *)*local_10 - 0x30U) {
        std::__cxx11::stringstream::stringstream(local_548);
        poVar2 = std::operator<<(local_538,"couldn\'t lex number, junk after exponent sign: ");
        std::operator<<(poVar2,*(char *)*local_10);
        uVar3 = __cxa_allocate_exception(0x60);
        std::__cxx11::stringstream::str();
        StaticError::StaticError
                  (in_stack_fffffffffffffa20,
                   (string *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      local_24 = 7;
      break;
    case 7:
      if (9 < (int)*(char *)*local_10 - 0x30U) {
        return in_RDI;
      }
      local_24 = 7;
    }
    std::__cxx11::string::operator+=((string *)in_RDI,*(char *)*local_10);
    *local_10 = *local_10 + 1;
  } while( true );
}

Assistant:

std::string lex_number(const char *&c, const std::string &filename, const Location &begin)
{
    // This function should be understood with reference to the linked image:
    // https://www.json.org/img/number.png

    // Note, we deviate from the json.org documentation as follows:
    // There is no reason to lex negative numbers as atomic tokens, it is better to parse them
    // as a unary operator combined with a numeric literal.  This avoids x-1 being tokenized as
    // <identifier> <number> instead of the intended <identifier> <binop> <number>.

    enum State {
        BEGIN,
        AFTER_ZERO,
        AFTER_ONE_TO_NINE,
        AFTER_DOT,
        AFTER_DIGIT,
        AFTER_E,
        AFTER_EXP_SIGN,
        AFTER_EXP_DIGIT
    } state;

    std::string r;

    state = BEGIN;
    while (true) {
        switch (state) {
            case BEGIN:
                switch (*c) {
                    case '0': state = AFTER_ZERO; break;

                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: throw StaticError(filename, begin, "couldn't lex number");
                }
                break;

            case AFTER_ZERO:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    default: goto end;
                }
                break;

            case AFTER_ONE_TO_NINE:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: goto end;
                }
                break;

            case AFTER_DOT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after decimal point: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_DIGIT:
                switch (*c) {
                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: goto end;
                }
                break;

            case AFTER_E:
                switch (*c) {
                    case '+':
                    case '-': state = AFTER_EXP_SIGN; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after 'E': " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_SIGN:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after exponent sign: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_DIGIT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: goto end;
                }
                break;
        }
        r += *c;
        c++;
    }
end:
    return r;
}